

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandUnBuffer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  FILE *__s;
  char *pcVar4;
  uint fVerbose;
  size_t __size;
  char *pcVar5;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"ivh"), iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x69) {
      fwrite("usage: unbuffer [-ivh]\n",0x17,1,(FILE *)pAbc->Err);
      fwrite("\t           collapses buffer/inverter trees\n",0x2c,1,(FILE *)pAbc->Err);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-i       : toggle removing interters [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
              pcVar5);
      __s = (FILE *)pAbc->Err;
      pcVar4 = "\t-h       : print the command usage\n";
      __size = 0x24;
LAB_0044f575:
      fwrite(pcVar4,__size,1,__s);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    __s = (FILE *)pAbc->Err;
    pcVar4 = "There is no current network.\n";
    __size = 0x1d;
  }
  else {
    if (pAVar3->ntkType == ABC_NTK_LOGIC) {
      if (bVar1) {
        pAVar3 = Abc_SclUnBufferPhase(pAVar3,fVerbose);
      }
      else {
        pAVar3 = Abc_SclUnBufferPerform(pAVar3,fVerbose);
      }
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"The command has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
      return 0;
    }
    __s = (FILE *)pAbc->Err;
    pcVar4 = "The current network is not a logic network.\n";
    __size = 0x2c;
  }
  goto LAB_0044f575;
}

Assistant:

int Scl_CommandUnBuffer( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fRemInv = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'i':
            fRemInv ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        fprintf( pAbc->Err, "The current network is not a logic network.\n" );
        return 1;
    }
    if ( fRemInv )
        pNtkRes = Abc_SclUnBufferPhase( pNtk, fVerbose );
    else
        pNtkRes = Abc_SclUnBufferPerform( pNtk, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: unbuffer [-ivh]\n" );
    fprintf( pAbc->Err, "\t           collapses buffer/inverter trees\n" );
    fprintf( pAbc->Err, "\t-i       : toggle removing interters [default = %s]\n", fRemInv? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}